

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O1

result * __thiscall
lest::expression_lhs<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>const&>::
operator<(result *__return_storage_ptr__,
         expression_lhs<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>const&> *this
         ,char (*rhs) [6])

{
  lest *this_00;
  void *__s1;
  ulong uVar1;
  int iVar2;
  size_t sVar3;
  ulong __n;
  char (*in_R8) [6];
  undefined1 *local_d8;
  long local_d0;
  undefined1 local_c8 [16];
  bool local_b8;
  undefined1 *local_b0;
  long local_a8;
  undefined1 local_a0 [16];
  basic_string_view<char,_std::char_traits<char>_> local_90;
  char local_80 [16];
  string local_70;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  this_00 = *(lest **)this;
  __s1 = *(void **)this_00;
  uVar1 = *(ulong *)(this_00 + 8);
  sVar3 = strlen(*rhs);
  __n = uVar1;
  if (sVar3 < uVar1) {
    __n = sVar3;
  }
  iVar2 = memcmp(__s1,rhs,__n);
  if ((iVar2 == 0) && (iVar2 = 0, uVar1 != sVar3)) {
    iVar2 = -(uint)(uVar1 < sVar3);
  }
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"<","");
  local_90.data_ = local_80;
  std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_50,local_50 + local_48);
  to_string<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>,char[6]>
            (&local_70,this_00,&local_90,(string *)rhs,in_R8);
  local_d8 = local_c8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d8,local_70._M_dataplus._M_p,
             local_70._M_dataplus._M_p + local_70._M_string_length);
  local_b8 = SUB41((uint)iVar2 >> 0x1f,0);
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char*>((string *)&local_b0,local_d8,local_d8 + local_d0);
  __return_storage_ptr__->passed = local_b8;
  (__return_storage_ptr__->decomposition)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->decomposition).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->decomposition,local_b0,local_b0 + local_a8);
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_d8 != local_c8) {
    operator_delete(local_d8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (local_90.data_ != local_80) {
    operator_delete(local_90.data_);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

result operator> ( R const & rhs ) { return result( lhs >  rhs, to_string( lhs, ">" , rhs ) ); }